

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_options.cpp
# Opt level: O3

bool duckdb::SampleOptions::Equals(SampleOptions *a,SampleOptions *b)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  idx_t iVar4;
  idx_t iVar5;
  
  if (a == b) {
    return true;
  }
  if (b != (SampleOptions *)0x0 && a != (SampleOptions *)0x0) {
    uVar1 = (a->seed).index;
    uVar2 = (b->seed).index;
    if ((uVar2 != 0xffffffffffffffff) == (uVar1 != 0xffffffffffffffff)) {
      if ((uVar2 & uVar1) == 0xffffffffffffffff) {
        return true;
      }
      bVar3 = Value::operator!=(&a->sample_size,&b->sample_size);
      if (((!bVar3) && (a->is_percentage == b->is_percentage)) && (a->method == b->method)) {
        iVar4 = optional_idx::GetIndex(&a->seed);
        iVar5 = optional_idx::GetIndex(&b->seed);
        return iVar4 == iVar5;
      }
    }
  }
  return false;
}

Assistant:

bool SampleOptions::Equals(SampleOptions *a, SampleOptions *b) {
	if (a == b) {
		return true;
	}
	if (!a || !b) {
		return false;
	}
	// if only one is valid, they are not equal
	if (a->seed.IsValid() != b->seed.IsValid()) {
		return false;
	}
	// if both are invalid, then they are technically the same
	if (!a->seed.IsValid() && !b->seed.IsValid()) {
		return true;
	}
	if (a->sample_size != b->sample_size || a->is_percentage != b->is_percentage || a->method != b->method ||
	    a->seed.GetIndex() != b->seed.GetIndex()) {
		return false;
	}
	return true;
}